

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_combiner.cpp
# Opt level: O1

FilterPushdownResult __thiscall
duckdb::FilterCombiner::TryPushdownConstantFilter
          (FilterCombiner *this,TableFilterSet *table_filters,
          vector<duckdb::ColumnIndex,_true> *column_ids,column_t expr_id,
          vector<duckdb::FilterCombiner::ExpressionValueInformation,_true> *info_list)

{
  PhysicalType PVar1;
  LogicalTypeId comparison_type_p;
  ulong uVar2;
  Value *pVVar3;
  bool bVar4;
  reference pvVar5;
  _Base_ptr p_Var6;
  ConstantFilter *this_00;
  _Base_ptr p_Var7;
  FilterPushdownResult FVar8;
  _Base_ptr p_Var9;
  Value *other;
  ColumnIndex column_index;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> local_c0;
  long *local_b8;
  FilterCombiner *local_b0;
  const_iterator local_a8;
  reference local_a0;
  TableFilterSet *local_98;
  ColumnIndex local_90;
  Value local_70;
  
  if ((info_list->
      super_vector<duckdb::FilterCombiner::ExpressionValueInformation,_std::allocator<duckdb::FilterCombiner::ExpressionValueInformation>_>
      ).
      super__Vector_base<duckdb::FilterCombiner::ExpressionValueInformation,_std::allocator<duckdb::FilterCombiner::ExpressionValueInformation>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (info_list->
      super_vector<duckdb::FilterCombiner::ExpressionValueInformation,_std::allocator<duckdb::FilterCombiner::ExpressionValueInformation>_>
      ).
      super__Vector_base<duckdb::FilterCombiner::ExpressionValueInformation,_std::allocator<duckdb::FilterCombiner::ExpressionValueInformation>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    FVar8 = NO_PUSHDOWN;
  }
  else {
    local_b0 = this;
    local_98 = table_filters;
    pvVar5 = vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>::operator[]
                       (info_list,0);
    bVar4 = TypeIsNumeric((pvVar5->constant).type_.physical_type_);
    if ((((bVar4) || (PVar1 = (pvVar5->constant).type_.physical_type_, PVar1 == VARCHAR)) ||
        (FVar8 = NO_PUSHDOWN, PVar1 == BOOL)) &&
       (FVar8 = NO_PUSHDOWN, (byte)(pvVar5->comparison_type - COMPARE_BOUNDARY_START) < 6)) {
      p_Var9 = &(local_b0->equivalence_map)._M_t._M_impl.super__Rb_tree_header._M_header;
      p_Var6 = p_Var9;
      for (p_Var7 = (local_b0->equivalence_map)._M_t._M_impl.super__Rb_tree_header._M_header.
                    _M_parent; p_Var7 != (_Base_ptr)0x0;
          p_Var7 = (&p_Var7->_M_left)[*(ulong *)(p_Var7 + 1) < expr_id]) {
        if (*(ulong *)(p_Var7 + 1) >= expr_id) {
          p_Var6 = p_Var7;
        }
      }
      if ((p_Var6 != p_Var9) && (*(ulong *)(p_Var6 + 1) <= expr_id)) {
        p_Var9 = p_Var6;
      }
      if ((long)p_Var9[1]._M_left - (long)p_Var9[1]._M_parent == 8) {
        FVar8 = NO_PUSHDOWN;
        local_a0 = vector<std::reference_wrapper<duckdb::Expression>,_true>::operator[]
                             ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)
                              &p_Var9[1]._M_parent,0);
        uVar2 = *(ulong *)(p_Var9 + 1);
        local_90.index = 0xffffffffffffffff;
        local_90.child_indexes.
        super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
        super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_90.child_indexes.
        super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
        super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_90.child_indexes.
        super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
        super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_a8._M_node = p_Var9;
        bVar4 = TryGetBoundColumnIndex(column_ids,local_a0->_M_data,&local_90);
        if (bVar4) {
          p_Var6 = &(local_b0->constant_values)._M_t._M_impl.super__Rb_tree_header._M_header;
          p_Var7 = p_Var6;
          for (p_Var9 = (local_b0->constant_values)._M_t._M_impl.super__Rb_tree_header._M_header.
                        _M_parent; p_Var9 != (_Base_ptr)0x0;
              p_Var9 = (&p_Var9->_M_left)[*(ulong *)(p_Var9 + 1) < uVar2]) {
            if (*(ulong *)(p_Var9 + 1) >= uVar2) {
              p_Var7 = p_Var9;
            }
          }
          if ((p_Var7 != p_Var6) && (*(ulong *)(p_Var7 + 1) <= uVar2)) {
            p_Var6 = p_Var7;
          }
          other = (Value *)p_Var6[1]._M_parent;
          pVVar3 = (Value *)p_Var6[1]._M_left;
          if (other != pVVar3) {
            do {
              this_00 = (ConstantFilter *)operator_new(0x50);
              comparison_type_p = other[1].type_.id_;
              Value::Value(&local_70,other);
              ConstantFilter::ConstantFilter(this_00,comparison_type_p,&local_70);
              Value::~Value(&local_70);
              local_c0._M_head_impl = (TableFilter *)this_00;
              PushDownFilterIntoExpr
                        ((duckdb *)&local_b8,local_a0->_M_data,
                         (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                          *)&local_c0);
              TableFilterSet::PushFilter
                        (local_98,&local_90,
                         (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                          *)&local_b8);
              if (local_b8 != (long *)0x0) {
                (**(code **)(*local_b8 + 8))();
              }
              local_b8 = (long *)0x0;
              if ((ConstantFilter *)local_c0._M_head_impl != (ConstantFilter *)0x0) {
                (*((TableFilter *)&(local_c0._M_head_impl)->_vptr_TableFilter)->_vptr_TableFilter[1]
                )();
              }
              local_c0._M_head_impl = (TableFilter *)0x0;
              other = (Value *)&other[1].type_.type_info_;
            } while (other != pVVar3);
          }
          ::std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<duckdb::Expression>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<duckdb::Expression>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<duckdb::Expression>,_true>_>_>_>
          ::_M_erase_aux(&(local_b0->equivalence_map)._M_t,local_a8);
          FVar8 = PUSHED_DOWN_FULLY;
        }
        ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::~vector
                  (&local_90.child_indexes.
                    super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>);
      }
    }
  }
  return FVar8;
}

Assistant:

FilterPushdownResult FilterCombiner::TryPushdownConstantFilter(TableFilterSet &table_filters,
                                                               const vector<ColumnIndex> &column_ids, column_t expr_id,
                                                               vector<ExpressionValueInformation> &info_list) {
	if (info_list.empty()) {
		// no constants - already removed
		return FilterPushdownResult::NO_PUSHDOWN;
	}
	auto &constant_info = info_list[0];
	// check if the type is supported
	if (!TypeSupportsConstantFilter(constant_info.constant.type())) {
		// not supported
		return FilterPushdownResult::NO_PUSHDOWN;
	}
	if (!SupportedFilterComparison(constant_info.comparison_type)) {
		return FilterPushdownResult::NO_PUSHDOWN;
	}
	//! Here we check if these filters are column references
	auto filter_exp = equivalence_map.find(expr_id);
	if (filter_exp->second.size() != 1) {
		return FilterPushdownResult::NO_PUSHDOWN;
	}

	auto &expr = filter_exp->second[0];
	auto equiv_set = filter_exp->first;

	// Try to get the column index, either from bound column ref, or a column ref nested inside of a
	// struct_extract call
	ColumnIndex column_index;
	if (!TryGetBoundColumnIndex(column_ids, expr, column_index)) {
		return FilterPushdownResult::NO_PUSHDOWN;
	}

	auto &constant_list = constant_values.find(equiv_set)->second;
	for (auto &constant_cmp : constant_list) {
		auto constant_filter = make_uniq<ConstantFilter>(constant_cmp.comparison_type, constant_cmp.constant);
		table_filters.PushFilter(column_index, PushDownFilterIntoExpr(expr, std::move(constant_filter)));
	}
	equivalence_map.erase(filter_exp);
	return FilterPushdownResult::PUSHED_DOWN_FULLY;
}